

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popt.c
# Opt level: O3

int handleAlias(poptContext con,char *longName,size_t longNameLen,char shortName,char *nextArg)

{
  optionStackEntry *argcPtr;
  optionStackEntry *poVar1;
  poptItem ppVar2;
  char **ppcVar3;
  poptItem ppVar4;
  int iVar5;
  long lVar6;
  char **argv;
  long lVar7;
  ulong uVar8;
  poptItem opt;
  
  poVar1 = con->os;
  ppVar2 = poVar1->currAlias;
  if (((ppVar2 == (poptItem)0x0) ||
      ((((longName == (char *)0x0 || ((ppVar2->option).longName == (char *)0x0)) ||
        (iVar5 = longOptionStrcmp(&ppVar2->option,longName,longNameLen), iVar5 == 0)) &&
       ((shortName == '\0' || ((ppVar2->option).shortName != shortName)))))) &&
     ((ppVar2 = con->aliases, ppVar2 != (poptItem)0x0 && (lVar6 = (long)con->numAliases, 0 < lVar6))
     )) {
    uVar8 = lVar6 + 1;
    ppVar4 = ppVar2 + lVar6;
    do {
      opt = ppVar4 + -1;
      if (longName == (char *)0x0) {
        if (ppVar4[-1].option.shortName == shortName) goto LAB_00104500;
      }
      else if (((opt->option).longName != (char *)0x0) &&
              (iVar5 = longOptionStrcmp(&opt->option,longName,longNameLen), iVar5 != 0)) {
LAB_00104500:
        if ((long)poVar1 - (long)con == 0x240) {
          return -0xd;
        }
        if ((nextArg != (char *)0x0 && longName == (char *)0x0) && (*nextArg != '\0')) {
          poVar1->nextCharArg = nextArg;
        }
        argcPtr = poVar1 + 1;
        con->os = argcPtr;
        poVar1[1].next = 0;
        poVar1[1].stuffed = 0;
        uVar8 = uVar8 - 2 & 0xffffffff;
        ppVar4 = ppVar2 + uVar8;
        poVar1[1].nextArg = (char *)0x0;
        poVar1[1].nextCharArg = (char *)0x0;
        poVar1[1].currAlias = ppVar4;
        iVar5 = ppVar2[uVar8].argc;
        lVar6 = (long)iVar5;
        if (((longName == (char *)0x0 || nextArg == (char *)0x0) || (*nextArg == '\0')) ||
           (argv = (char **)malloc(lVar6 * 8 + 0x10), argv == (char **)0x0)) {
          argv = ppVar4->argv;
          iVar5 = poptDupArgv(iVar5,argv,&argcPtr->argc,&poVar1[1].argv);
          if (argv == (char **)0x0) goto LAB_0010463d;
        }
        else {
          if (0 < iVar5) {
            ppcVar3 = ppVar4->argv;
            lVar7 = 0;
            do {
              argv[lVar7] = ppcVar3[lVar7];
              lVar7 = lVar7 + 1;
            } while (lVar6 != lVar7);
          }
          argv[lVar6] = nextArg;
          argv[lVar6 + 1] = (char *)0x0;
          iVar5 = poptDupArgv(iVar5 + 1,argv,&argcPtr->argc,&poVar1[1].argv);
        }
        if (argv != con->os->currAlias->argv) {
          free(argv);
        }
LAB_0010463d:
        con->os->argb = (pbm_set *)0x0;
        return iVar5 + (uint)(iVar5 == 0);
      }
      uVar8 = uVar8 - 1;
      ppVar4 = opt;
    } while (1 < uVar8);
  }
  return 0;
}

Assistant:

static int handleAlias(poptContext con,
		const char * longName, size_t longNameLen,
		char shortName,
		const char * nextArg)
{
    poptItem item = con->os->currAlias;
    int rc;
    int i;

    if (item) {
	if (longName && item->option.longName != NULL
	 && longOptionStrcmp(&item->option, longName, longNameLen))
	    return 0;
	else
	if (shortName && shortName == item->option.shortName)
	    return 0;
    }

    if (con->aliases == NULL || con->numAliases <= 0) /* XXX can't happen */
	return 0;

    for (i = con->numAliases - 1; i >= 0; i--) {
	item = con->aliases + i;
	if (longName) {
	    if (item->option.longName == NULL)
		continue;
	    if (!longOptionStrcmp(&item->option, longName, longNameLen))
		continue;
	} else if (shortName != item->option.shortName)
	    continue;
	break;
    }
    if (i < 0) return 0;

    if ((con->os - con->optionStack + 1) == POPT_OPTION_DEPTH)
	return POPT_ERROR_OPTSTOODEEP;

    if (longName == NULL && nextArg != NULL && *nextArg != '\0')
	con->os->nextCharArg = nextArg;

    con->os++;
    con->os->next = 0;
    con->os->stuffed = 0;
    con->os->nextArg = NULL;
    con->os->nextCharArg = NULL;
    con->os->currAlias = con->aliases + i;
    {	const char ** av;
	int ac = con->os->currAlias->argc;
	/* Append --foo=bar arg to alias argv array (if present). */ 
	if (longName && nextArg != NULL && *nextArg != '\0') {
	    av = malloc((ac + 1 + 1) * sizeof(*av));
	    if (av != NULL) {	/* XXX won't happen. */
		for (i = 0; i < ac; i++) {
		    av[i] = con->os->currAlias->argv[i];
		}
		av[ac++] = nextArg;
		av[ac] = NULL;
	    } else	/* XXX revert to old popt behavior if malloc fails. */
		av = con->os->currAlias->argv;
	} else
	    av = con->os->currAlias->argv;
	rc = poptDupArgv(ac, av, &con->os->argc, &con->os->argv);
	if (av != NULL && av != con->os->currAlias->argv)
	    free(av);
    }
    con->os->argb = NULL;

    return (rc ? rc : 1);
}